

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cc
# Opt level: O3

vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> * __thiscall
prometheus::Registry::Collect
          (vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
           *__return_storage_ptr__,Registry *this)

{
  mutex *__mutex;
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  pointer puVar5;
  int iVar6;
  undefined8 uVar7;
  const_iterator __end0;
  const_iterator __begin0_4;
  pointer puVar8;
  const_iterator __begin0;
  pointer puVar9;
  pointer puVar10;
  pointer puVar11;
  pointer puVar12;
  vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> local_48;
  
  __mutex = &this->mutex_;
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar6 == 0) {
    (__return_storage_ptr__->
    super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>)._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>)._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>)._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    puVar1 = (this->counters_).
             super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar9 = (this->counters_).
                  super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar9 != puVar1; puVar9 = puVar9 + 1)
    {
      (*(((puVar9->_M_t).
          super___uniq_ptr_impl<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_prometheus::Family<prometheus::Counter>_*,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>
          .super__Head_base<0UL,_prometheus::Family<prometheus::Counter>_*,_false>._M_head_impl)->
        super_Collectable)._vptr_Collectable[2])(&local_48);
      std::vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>>::
      _M_range_insert<std::move_iterator<__gnu_cxx::__normal_iterator<prometheus::MetricFamily*,std::vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>>>>>
                ((vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>> *)
                 __return_storage_ptr__,
                 (__return_storage_ptr__->
                 super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                 )._M_impl.super__Vector_impl_data._M_finish,
                 local_48.
                 super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_48.
                 super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::~vector
                (&local_48);
    }
    puVar2 = (this->gauges_).
             super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar10 = (this->gauges_).
                   super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar10 != puVar2;
        puVar10 = puVar10 + 1) {
      (*(((puVar10->_M_t).
          super___uniq_ptr_impl<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_prometheus::Family<prometheus::Gauge>_*,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>
          .super__Head_base<0UL,_prometheus::Family<prometheus::Gauge>_*,_false>._M_head_impl)->
        super_Collectable)._vptr_Collectable[2])(&local_48);
      std::vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>>::
      _M_range_insert<std::move_iterator<__gnu_cxx::__normal_iterator<prometheus::MetricFamily*,std::vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>>>>>
                ((vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>> *)
                 __return_storage_ptr__,
                 (__return_storage_ptr__->
                 super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                 )._M_impl.super__Vector_impl_data._M_finish,
                 local_48.
                 super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_48.
                 super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::~vector
                (&local_48);
    }
    puVar3 = (this->histograms_).
             super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar11 = (this->histograms_).
                   super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar11 != puVar3;
        puVar11 = puVar11 + 1) {
      (*(((puVar11->_M_t).
          super___uniq_ptr_impl<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_prometheus::Family<prometheus::Histogram>_*,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>
          .super__Head_base<0UL,_prometheus::Family<prometheus::Histogram>_*,_false>._M_head_impl)->
        super_Collectable)._vptr_Collectable[2])(&local_48);
      std::vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>>::
      _M_range_insert<std::move_iterator<__gnu_cxx::__normal_iterator<prometheus::MetricFamily*,std::vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>>>>>
                ((vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>> *)
                 __return_storage_ptr__,
                 (__return_storage_ptr__->
                 super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                 )._M_impl.super__Vector_impl_data._M_finish,
                 local_48.
                 super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_48.
                 super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::~vector
                (&local_48);
    }
    puVar4 = (this->infos_).
             super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar12 = (this->infos_).
                   super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar12 != puVar4;
        puVar12 = puVar12 + 1) {
      (*(((puVar12->_M_t).
          super___uniq_ptr_impl<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_prometheus::Family<prometheus::Info>_*,_std::default_delete<prometheus::Family<prometheus::Info>_>_>
          .super__Head_base<0UL,_prometheus::Family<prometheus::Info>_*,_false>._M_head_impl)->
        super_Collectable)._vptr_Collectable[2])(&local_48);
      std::vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>>::
      _M_range_insert<std::move_iterator<__gnu_cxx::__normal_iterator<prometheus::MetricFamily*,std::vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>>>>>
                ((vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>> *)
                 __return_storage_ptr__,
                 (__return_storage_ptr__->
                 super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                 )._M_impl.super__Vector_impl_data._M_finish,
                 local_48.
                 super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_48.
                 super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::~vector
                (&local_48);
    }
    puVar5 = (this->summaries_).
             super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar8 = (this->summaries_).
                  super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar5; puVar8 = puVar8 + 1)
    {
      (*(((puVar8->_M_t).
          super___uniq_ptr_impl<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_prometheus::Family<prometheus::Summary>_*,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>
          .super__Head_base<0UL,_prometheus::Family<prometheus::Summary>_*,_false>._M_head_impl)->
        super_Collectable)._vptr_Collectable[2])(&local_48);
      std::vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>>::
      _M_range_insert<std::move_iterator<__gnu_cxx::__normal_iterator<prometheus::MetricFamily*,std::vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>>>>>
                ((vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>> *)
                 __return_storage_ptr__,
                 (__return_storage_ptr__->
                 super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                 )._M_impl.super__Vector_impl_data._M_finish,
                 local_48.
                 super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_48.
                 super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::~vector
                (&local_48);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return __return_storage_ptr__;
  }
  uVar7 = std::__throw_system_error(iVar6);
  std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::~vector
            (__return_storage_ptr__);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar7);
}

Assistant:

std::vector<MetricFamily> Registry::Collect() const {
  std::lock_guard<std::mutex> lock{mutex_};
  auto results = std::vector<MetricFamily>{};

  CollectAll(results, counters_);
  CollectAll(results, gauges_);
  CollectAll(results, histograms_);
  CollectAll(results, infos_);
  CollectAll(results, summaries_);

  return results;
}